

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O1

void __thiscall Graph::run_GreedyAlgorithm(Graph *this)

{
  double dVar1;
  Car *pCVar2;
  Node a;
  bool bVar3;
  ulong uVar4;
  bool bVar5;
  ulong uVar6;
  bool *pbVar7;
  ulong unaff_RBP;
  ulong uVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  bool bVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  double local_88;
  
  iVar9 = 0;
  do {
    uVar6 = (ulong)this->num_node;
    bVar12 = (long)uVar6 < 2;
    if ((long)uVar6 < 2) {
LAB_00106b29:
      if (bVar12) break;
    }
    else if (this->nodes[1].visited == true) {
      pbVar7 = &this->nodes[2].visited;
      uVar4 = 2;
      do {
        uVar8 = uVar4;
        if (uVar6 == uVar8) break;
        bVar12 = *pbVar7;
        pbVar7 = pbVar7 + 0x20;
        uVar4 = uVar8 + 1;
      } while (bVar12 != false);
      bVar12 = uVar6 <= uVar8;
      goto LAB_00106b29;
    }
    pCVar2 = this->cars;
    if (pCVar2[iVar9].tour.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
        super__Vector_impl_data._M_start ==
        pCVar2[iVar9].tour.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      Car::add_node(pCVar2 + iVar9,this->nodes,this->distance_matrix);
    }
    bVar12 = true;
    if (1 < this->num_node) {
      bVar3 = true;
      bVar12 = true;
      uVar6 = 1;
      lVar11 = 0;
      local_88 = 100000.0;
      do {
        if ((((&this->nodes[1].visited)[lVar11] == false) &&
            (bVar5 = Car::ok_capacity(this->cars + iVar9,*(Node *)((long)&this->nodes[1].x + lVar11)
                                     ), bVar5)) &&
           (pbVar7 = &this->nodes[1].visited + lVar11, a._16_8_ = *(undefined8 *)pbVar7,
           a._0_16_ = *(undefined1 (*) [16])((long)&this->nodes[1].x + lVar11),
           a._24_8_ = *(undefined8 *)(pbVar7 + 8),
           bVar5 = Car::ok_time(this->cars + iVar9,a,this->distance_matrix), bVar5)) {
          dVar1 = this->distance_matrix[this->cars[iVar9].now_idx][uVar6];
          uVar13 = SUB84(local_88,0);
          uVar14 = (undefined4)((ulong)local_88 >> 0x20);
          if (dVar1 < local_88) {
            unaff_RBP = uVar6;
          }
          unaff_RBP = unaff_RBP & 0xffffffff;
          bVar12 = bVar3;
          if (dVar1 < local_88) {
            bVar12 = false;
            uVar14 = (int)((ulong)dVar1 >> 0x20);
            uVar13 = SUB84(dVar1,0);
          }
          local_88 = (double)CONCAT44(uVar14,uVar13);
          bVar3 = bVar12;
        }
        uVar6 = uVar6 + 1;
        lVar11 = lVar11 + 0x20;
      } while ((long)uVar6 < (long)this->num_node);
    }
    if (bVar12) {
      iVar10 = iVar9 + 1;
      if (iVar10 < this->num_car) {
        bVar12 = true;
        if (this->cars[iVar9].now_idx != 0) {
          Car::add_node(this->cars + iVar9,this->nodes,this->distance_matrix);
        }
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Cannot solve this by Greedy algorithm.",0x26);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
        std::ostream::put('\x10');
        std::ostream::flush();
        bVar12 = false;
        iVar10 = iVar9;
      }
    }
    else {
      Car::add_node(this->cars + iVar9,this->nodes + (int)unaff_RBP,this->distance_matrix);
      bVar12 = true;
      iVar10 = iVar9;
    }
    iVar9 = iVar10;
  } while (bVar12);
  if (this->cars[iVar9].now_idx != 0) {
    Car::add_node(this->cars + iVar9,this->nodes,this->distance_matrix);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"algorithm done.",0xf);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
  std::ostream::put('\x10');
  std::ostream::flush();
  return;
}

Assistant:

void Graph::run_GreedyAlgorithm()
{
	int car_idx = 0;
	while(!is_all_visited()){
		int best_node_idx;
		double min_distance = 100000;
		bool is_return_depot = true;
		
		if(cars[car_idx].tour.empty()){
			cars[car_idx].add_node(&nodes[0], distance_matrix);// nodes[0] is depot
		}

		for(int node_idx = 1; node_idx < num_node; node_idx++){
			if(!nodes[node_idx].visited){
				if(cars[car_idx].ok_capacity(nodes[node_idx])){
					if(cars[car_idx].ok_time(nodes[node_idx], distance_matrix)){
						double tmp_distance = distance_matrix[cars[car_idx].now_idx][node_idx];
						if(tmp_distance < min_distance){
							min_distance = tmp_distance;
							is_return_depot = false;
							best_node_idx = node_idx;
						}
					}
				}
			}
		}

		if(!is_return_depot){
			cars[car_idx].add_node(&nodes[best_node_idx], distance_matrix);
		}
		else{// if edges are not found, return depot
			if(car_idx + 1 < num_car){// check if the rest of vehicles exists
				if(cars[car_idx].now_idx != 0){// in case the vehicle did not return back to the depot
					cars[car_idx].add_node(&nodes[0], distance_matrix);
				}
				car_idx += 1;// assign next vehicle
			}
			else{
				std::cout << "Cannot solve this by Greedy algorithm." << std::endl;
				break;// std::exit(0);
			}
			
		}
	}//while loop done
	if(cars[car_idx].now_idx != 0){// in case the vehicle did not return back to the depot
				cars[car_idx].add_node(&nodes[0], distance_matrix);
	}
	std::cout << "algorithm done." << std::endl;
}